

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

EGLConfig eglu::chooseSingleConfig(Library *egl,EGLDisplay display,EGLint *attribList)

{
  value_type pvVar1;
  bool bVar2;
  NotSupportedError *this;
  const_reference ppvVar3;
  undefined1 local_38 [8];
  vector<void_*,_std::allocator<void_*>_> configs;
  EGLint *attribList_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)attribList;
  chooseConfigs((vector<void_*,_std::allocator<void_*>_> *)local_38,egl,display,attribList);
  bVar2 = std::vector<void_*,_std::allocator<void_*>_>::empty
                    ((vector<void_*,_std::allocator<void_*>_> *)local_38);
  if (!bVar2) {
    ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::front
                        ((vector<void_*,_std::allocator<void_*>_> *)local_38);
    pvVar1 = *ppvVar3;
    std::vector<void_*,_std::allocator<void_*>_>::~vector
              ((vector<void_*,_std::allocator<void_*>_> *)local_38);
    return pvVar1;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"No matching EGL config found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0xa0);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

EGLConfig chooseSingleConfig (const Library& egl, EGLDisplay display, const EGLint* attribList)
{
	const vector<EGLConfig> configs (chooseConfigs(egl, display, attribList));
	if (configs.empty())
		TCU_THROW(NotSupportedError, "No matching EGL config found");

	return configs.front();
}